

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  char *pcVar4;
  uint8_t *start;
  string local_88;
  LogMessage local_68;
  ulong local_30;
  size_t byte_size;
  size_t old_size;
  string *output_local;
  MessageLite *this_local;
  
  old_size = (size_t)output;
  output_local = (string *)this;
  byte_size = std::__cxx11::string::size();
  iVar2 = (*this->_vptr_MessageLite[8])();
  local_30 = CONCAT44(extraout_var,iVar2);
  bVar1 = local_30 < 0x80000000;
  if (bVar1) {
    STLStringResizeUninitializedAmortized((string *)old_size,byte_size + local_30);
    pcVar4 = io::mutable_string_data((string *)old_size);
    SerializeToArrayImpl(this,(uint8_t *)(pcVar4 + byte_size),(int)local_30);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1c2);
    (*this->_vptr_MessageLite[2])(&local_88);
    pLVar3 = internal::LogMessage::operator<<(&local_68,&local_88);
    pLVar3 = internal::LogMessage::operator<<(pLVar3," exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,local_30);
    internal::LogFinisher::operator=((LogFinisher *)((long)&start + 3),pLVar3);
    std::__cxx11::string::~string((string *)&local_88);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return bVar1;
}

Assistant:

bool MessageLite::AppendPartialToString(std::string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitializedAmortized(output, old_size + byte_size);
  uint8_t* start =
      reinterpret_cast<uint8_t*>(io::mutable_string_data(output) + old_size);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}